

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KrazyMeans.cpp
# Opt level: O0

void __thiscall KrazyMeans::selectRandomCentroids(KrazyMeans *this)

{
  bool bVar1;
  element_type *peVar2;
  size_t sVar3;
  long in_RDI;
  FeatureVec *vector;
  iterator __end1;
  iterator __begin1;
  vector<FeatureVec,_std::allocator<FeatureVec>_> *__range1;
  UniformRandomGenerator<long> rg;
  vector<FeatureVec,_std::allocator<FeatureVec>_> *in_stack_ffffffffffffec28;
  UniformRandomGenerator<long> *in_stack_ffffffffffffec30;
  __normal_iterator<FeatureVec_*,_std::vector<FeatureVec,_std::allocator<FeatureVec>_>_> local_13b0;
  long local_13a8;
  
  UniformRandomGenerator<long>::UniformRandomGenerator
            (in_stack_ffffffffffffec30,(int)((ulong)in_stack_ffffffffffffec28 >> 0x20));
  local_13a8 = in_RDI + 0x38;
  local_13b0._M_current =
       (FeatureVec *)
       std::vector<FeatureVec,_std::allocator<FeatureVec>_>::begin(in_stack_ffffffffffffec28);
  std::vector<FeatureVec,_std::allocator<FeatureVec>_>::end(in_stack_ffffffffffffec28);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<FeatureVec_*,_std::vector<FeatureVec,_std::allocator<FeatureVec>_>_>
                        *)in_stack_ffffffffffffec30,
                       (__normal_iterator<FeatureVec_*,_std::vector<FeatureVec,_std::allocator<FeatureVec>_>_>
                        *)in_stack_ffffffffffffec28);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<FeatureVec_*,_std::vector<FeatureVec,_std::allocator<FeatureVec>_>_>::
    operator*(&local_13b0);
    peVar2 = std::__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x10b352);
    in_stack_ffffffffffffec28 = &peVar2->vectors;
    in_stack_ffffffffffffec30 =
         (UniformRandomGenerator<long> *)
         UniformRandomGenerator<long>::next((UniformRandomGenerator<long> *)0x10b364);
    std::__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x10b373);
    sVar3 = DataSet::size((DataSet *)0x10b37b);
    std::vector<FeatureVec,_std::allocator<FeatureVec>_>::operator[]
              (in_stack_ffffffffffffec28,(ulong)in_stack_ffffffffffffec30 % sVar3);
    FeatureVec::operator=
              ((FeatureVec *)in_stack_ffffffffffffec30,(FeatureVec *)in_stack_ffffffffffffec28);
    __gnu_cxx::
    __normal_iterator<FeatureVec_*,_std::vector<FeatureVec,_std::allocator<FeatureVec>_>_>::
    operator++(&local_13b0);
  }
  return;
}

Assistant:

void KrazyMeans::selectRandomCentroids() {
  UniformRandomGenerator<long> rg;
  // For each cluster centroid, randomly select a feature vector as initialization.
  for (auto &vector : centroids) {
    vector = data_set->vectors[rg.next() % data_set->size()];
  }
}